

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

bool __thiscall woff2::Buffer::ReadU16(Buffer *this,uint16_t *value)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t *value_local;
  Buffer *this_local;
  
  bVar1 = this->offset_ + 2 <= this->length_;
  if (bVar1) {
    *value = *(uint16_t *)(this->buffer_ + this->offset_);
    uVar2 = ntohs(*value);
    *value = uVar2;
    this->offset_ = this->offset_ + 2;
  }
  return bVar1;
}

Assistant:

bool ReadU16(uint16_t *value) {
    if (offset_ + 2 > length_) {
      return FONT_COMPRESSION_FAILURE();
    }
    std::memcpy(value, buffer_ + offset_, sizeof(uint16_t));
    *value = ntohs(*value);
    offset_ += 2;
    return true;
  }